

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<double>::TPZVec(TPZVec<double> *this,TPZVec<double> *copy)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  int64_t i;
  ulong uVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  this->fStore = (double *)0x0;
  uVar1 = copy->fNElements;
  if (0 < (long)uVar1) {
    uVar4 = 0;
    pdVar3 = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = pdVar3;
    pdVar2 = copy->fStore;
    do {
      pdVar3[uVar4] = pdVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  this->fNElements = uVar1;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}